

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void ecs_map_remove(ecs_map_t *map,ecs_map_key_t key)

{
  int iVar1;
  ecs_bucket_t *bucket_00;
  int local_24;
  int32_t bucket_count;
  int32_t i;
  ecs_bucket_t *bucket;
  ecs_map_key_t key_local;
  ecs_map_t *map_local;
  
  _ecs_assert(map != (ecs_map_t *)0x0,2,(char *)0x0,"map != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/map.c"
              ,0x162);
  if (map == (ecs_map_t *)0x0) {
    __assert_fail("map != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/map.c"
                  ,0x162,"void ecs_map_remove(ecs_map_t *, ecs_map_key_t)");
  }
  bucket_00 = get_bucket(map,key);
  if (bucket_00 != (ecs_bucket_t *)0x0) {
    iVar1 = bucket_00->count;
    for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
      if (bucket_00->keys[local_24] == key) {
        remove_from_bucket(bucket_00,map->elem_size,key,local_24);
        map->count = map->count + -1;
      }
    }
  }
  return;
}

Assistant:

void ecs_map_remove(
    ecs_map_t *map,
    ecs_map_key_t key)
{
    ecs_assert(map != NULL, ECS_INVALID_PARAMETER, NULL);

    ecs_bucket_t * bucket = get_bucket(map, key);
    if (!bucket) {
        return;
    }

    int32_t i, bucket_count = bucket->count;
    for (i = 0; i < bucket_count; i ++) {
        if (bucket->keys[i] == key) {
            remove_from_bucket(bucket, map->elem_size, key, i);
            map->count --;
        }
    } 
}